

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O2

ostream * indigox::operator<<(ostream *s,Element_p *e)

{
  ostream *poVar1;
  String local_30;
  
  Element::ToString_abi_cxx11_
            (&local_30,(e->super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  poVar1 = std::operator<<(s,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& s, ix::Element_p e) {
    return (s << e->ToString());
  }